

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

void __thiscall FileWriter::FileWriter(FileWriter *this,string *filename)

{
  _Ios_Openmode _Var1;
  string *filename_local;
  FileWriter *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)filename);
  _Var1 = std::operator|(_S_out,_S_bin);
  std::fstream::fstream((fstream *)&this->file,(string *)filename,_Var1);
  BufferWriter::BufferWriter(&this->buffer,0x80000);
  return;
}

Assistant:

FileWriter::FileWriter(const std::string &filename)
		: filename(filename),
		  file(std::fstream(filename, std::ios::out | std::ios::binary)),
		  buffer(BYTES_PER_BUFFER)
{
	
}